

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::SelfTestData_Sample::~SelfTestData_Sample(SelfTestData_Sample *this)

{
  SelfTestData_Sample *in_RDI;
  
  ~SelfTestData_Sample(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

SelfTestData_Sample::~SelfTestData_Sample() {
  // @@protoc_insertion_point(destructor:sentencepiece.SelfTestData.Sample)
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}